

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta)

{
  int k;
  float *pfVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bound_factor *pbVar2;
  bool bVar3;
  int selected;
  long lVar4;
  _Head_base<0UL,_int_*,_false> _Var5;
  bool bVar6;
  rc_data *__first;
  rc_data *__last;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  rc_size local_68;
  solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  *local_60;
  bit_array *local_58;
  int *local_50;
  solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
  *local_48;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current == last._M_current) {
    bVar6 = false;
  }
  else {
    local_48 = this + 0x10;
    bVar6 = false;
    local_60 = (solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                *)this;
    local_58 = x;
    local_50 = last._M_current;
    do {
      k = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_48);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        pfVar1 = (((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                    *)this)->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                 _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl;
        _Var5._M_head_impl = local_38._M_head_impl;
        do {
          pfVar1[*_Var5._M_head_impl] = theta * pfVar1[*_Var5._M_head_impl];
          _Var5._M_head_impl = _Var5._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var5._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      local_68 = solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                             *)this,(row_iterator)local_38._M_head_impl,
                            (row_iterator)
                            local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                            .super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      lVar4 = (long)local_68.r_size;
      if (1 < lVar4) {
        __g = ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                *)this)->rng;
        __first = (((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                     *)this)->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                  ._M_head_impl;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar4,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar4);
        __last = __first + 1;
        lVar4 = lVar4 * 0xc + -0xc;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar4 = lVar4 + -0xc;
        } while (lVar4 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        last._M_current = local_50;
        this = (solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
                *)local_60;
        x = local_58;
      }
      pbVar2 = (((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                  *)this)->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor_*,_false>
               ._M_head_impl;
      selected = solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                 ::select_variables((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                                     *)this,&local_68,pbVar2[k].min,pbVar2[k].max);
      bVar3 = affect<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                          *)this,x,(row_value *)local_38._M_head_impl,k,selected,local_68.r_size,
                         kappa,delta);
      bVar6 = (bool)(bVar6 | bVar3);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return bVar6;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }